

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void finish(svm_params *params)

{
  ostream *poVar1;
  
  free(params->pool);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,"Num support = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,
                           "Number of kernel evaluations = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"Number of cache queries = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,"Total loss = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,params->loss_sum);
  std::endl<char,std::char_traits<char>>(poVar1);
  free_svm_model(params->model);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,"Done freeing model");
  std::endl<char,std::char_traits<char>>(poVar1);
  free(params->kernel_params);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,"Done freeing kernel params")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(&(params->all->trace_message).super_ostream,"Done with finish ");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void finish(svm_params& params)
{
  free(params.pool);

  params.all->trace_message << "Num support = " << params.model->num_support << endl;
  params.all->trace_message << "Number of kernel evaluations = " << num_kernel_evals << " "
                            << "Number of cache queries = " << num_cache_evals << endl;
  params.all->trace_message << "Total loss = " << params.loss_sum << endl;

  free_svm_model(params.model);
  params.all->trace_message << "Done freeing model" << endl;
  if (params.kernel_params)
    free(params.kernel_params);
  params.all->trace_message << "Done freeing kernel params" << endl;
  params.all->trace_message << "Done with finish " << endl;
}